

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  istream *piVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  istream *piVar10;
  size_t sVar11;
  runtime_error *this;
  long *plVar12;
  bool bVar13;
  undefined1 local_6c8 [8];
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  socket;
  query query;
  resolver resolver;
  ostream request_stream;
  undefined1 local_360 [8];
  streambuf request;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f8;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 auStack_2c8 [8];
  streambuf response;
  size_type *local_260;
  string status_message;
  context context;
  string http_version;
  istream response_stream;
  ios_base local_1f8 [16];
  uint auStack_1e8 [62];
  size_type *local_f0;
  string path;
  long local_c8;
  size_type *local_c0;
  string parameters;
  string server;
  io_service io_service;
  string header;
  uint status_code;
  undefined1 local_40 [8];
  error_code ec;
  
  parameters.field_2._8_8_ = &server._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parameters.field_2 + 8),"www.instagram.com","");
  local_f0 = &path._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/accounts/login/ajax/","");
  local_c0 = &parameters._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"username=fewfw&password=fewfw","");
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)local_360,0xffffffffffffffff,
             (allocator<char> *)local_6c8);
  std::ostream::ostream(&resolver.impl_.executor_.prop_fns_,(streambuf *)local_360);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"POST ",5);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&resolver.impl_.executor_.prop_fns_,(char *)local_f0,
                      (long)path._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Host: ",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&resolver.impl_.executor_.prop_fns_,
                      (char *)parameters.field_2._8_8_,(long)server._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Accept: */*\r\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,
             "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Referer: https://",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&resolver.impl_.executor_.prop_fns_,
                      (char *)parameters.field_2._8_8_,(long)server._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/\r\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Content-Length: ",0x10);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&resolver.impl_.executor_.prop_fns_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,
             "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Connection: close\r\n\r\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,(char *)local_c0,
             (long)parameters._M_dataplus._M_p);
  boost::asio::ssl::context::context((context *)((long)&status_message.field_2 + 8),sslv23);
  boost::asio::ssl::context::set_default_verify_paths
            ((context *)((long)&status_message.field_2 + 8));
  boost::asio::io_context::io_context((io_context *)((long)&server.field_2 + 8));
  boost::system::error_code::error_code((error_code *)local_40);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::stream<boost::asio::io_context&>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)local_6c8,(io_context *)((long)&server.field_2 + 8),
             (context *)((long)&status_message.field_2 + 8));
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)((long)&query.service_name_.field_2 + 8),(io_context *)((long)&server.field_2 + 8),
             (type *)0x0);
  http_version.field_2._8_8_ = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&http_version.field_2 + 8),"https","");
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)&socket.core_.input_.size_,
             (string *)((long)&parameters.field_2 + 8),(string *)((long)&http_version.field_2 + 8),
             address_configured);
  if ((ios_base *)http_version.field_2._8_8_ != local_1f8) {
    operator_delete((void *)http_version.field_2._8_8_);
  }
  boost::asio::detail::resolver_service<boost::asio::ip::tcp>::resolve
            ((results_type *)((long)&http_version.field_2 + 8),
             (resolver_service<boost::asio::ip::tcp> *)query.service_name_.field_2._8_8_,
             (implementation_type *)&resolver,(query_type *)&socket.core_.input_.size_,
             (error_code *)local_40);
  uVar5 = http_version.field_2._8_8_;
  if (local_40[4] == true) {
    (**(code **)(*(long *)ec._0_8_ + 0x20))
              ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,local_40._0_4_);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                        (long)_response_stream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resolve OK",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::set_verify_mode((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_6c8,1,(error_code *)local_40);
    if (local_40[4] == true) {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,local_40._0_4_);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                          (long)_response_stream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    else {
      boost::asio::ssl::
      stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
      ::
      set_verify_callback<boost::_bi::bind_t<bool,bool(*)(bool,boost::asio::ssl::verify_context&),boost::_bi::list2<boost::arg<1>,boost::arg<2>>>>
                ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  *)local_6c8,_local_6c8,(error_code *)verify_certificate);
      if (local_40[4] == true) {
        (**(code **)(*(long *)ec._0_8_ + 0x20))
                  ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,local_40._0_4_);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                            (long)_response_stream);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      else {
        if (_response_stream != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
            UNLOCK();
          }
          else {
            _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
          }
        }
        if (_response_stream != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
            UNLOCK();
          }
          else {
            _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
          }
        }
        auStack_2c8 = (undefined1  [8])0x0;
        response.super_streambuf = (streambuf)0x0;
        response._1_7_ = 0;
        response._8_8_ = 0;
        http_version.field_2._8_8_ = uVar5;
        boost::asio::
        connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,boost::asio::detail::default_connect_condition>
                  (&request.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(asio *)local_6c8);
        if (response._0_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)response._0_8_);
        }
        if (_response_stream != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_response_stream);
        }
        if (local_2f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f8);
        }
        if (_response_stream != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_response_stream);
        }
        if (local_40[4] == true) {
          (**(code **)(*(long *)ec._0_8_ + 0x20))
                    ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,local_40._0_4_);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                              (long)_response_stream);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Connect OK",10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
          std::ostream::put('h');
          std::ostream::flush();
          http_version.field_2._8_8_ = http_version.field_2._8_8_ & 0xffffffff00000000;
          boost::asio::ssl::detail::
          io<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::ssl::detail::handshake_op>
                    ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)local_6c8,
                     (stream_core *)
                     &socket.next_layer_.
                      super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      .impl_.executor_.prop_fns_,(handshake_op *)((long)&http_version.field_2 + 8),
                     (error_code *)local_40);
          if (local_40[4] == true) {
            (**(code **)(*(long *)ec._0_8_ + 0x20))
                      ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,local_40._0_4_);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                                (long)_response_stream);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Handshake OK",0xc);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Print request:",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n****************************************\n",0x2a);
            if (request._8_8_ == 0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13f368);
            }
            else {
              sVar9 = strlen((char *)request._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)request._8_8_,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n****************************************",0x29);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
            http_version.field_2._8_8_ = (streambuf *)local_360;
            boost::asio::
            write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_all_t>
                      (local_6c8,(undefined1 *)((long)&http_version.field_2 + 8),local_40,0);
            if (local_40[4] != true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Write OK",8)
              ;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
                        ((basic_streambuf<std::allocator<char>_> *)auStack_2c8,0xffffffffffffffff,
                         (allocator<char> *)(http_version.field_2._M_local_buf + 8));
              http_version.field_2._8_8_ = local_1f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)((long)&http_version.field_2 + 8),"\r\n","");
              boost::asio::
              read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                        ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                          *)local_6c8,(basic_streambuf<std::allocator<char>_> *)auStack_2c8,
                         (string *)((long)&http_version.field_2 + 8));
              if ((ios_base *)http_version.field_2._8_8_ != local_1f8) {
                operator_delete((void *)http_version.field_2._8_8_);
              }
              std::istream::istream
                        ((istream *)(http_version.field_2._M_local_buf + 8),(streambuf *)auStack_2c8
                        );
              context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&http_version._M_string_length;
              http_version._M_dataplus._M_p = (pointer)0x0;
              http_version._M_string_length._0_1_ = 0;
              std::operator>>((istream *)(http_version.field_2._M_local_buf + 8),
                              (string *)
                              &context.init_.ref_.
                               super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
              std::istream::_M_extract<unsigned_int>
                        ((uint *)(http_version.field_2._M_local_buf + 8));
              local_260 = &status_message._M_string_length;
              status_message._M_dataplus._M_p = (pointer)0x0;
              status_message._M_string_length._0_1_ = 0;
              piVar1 = (istream *)(&http_version.field_2._M_allocated_capacity + 1);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (piVar1,(string *)&local_260);
              uVar2 = *(uint *)((long)auStack_1e8 + *(long *)(http_version.field_2._8_8_ + -0x18));
              bVar13 = true;
              if ((uVar2 & 5) == 0) {
                std::__cxx11::string::substr
                          ((ulong)local_2e8,
                           (ulong)&context.init_.ref_.
                                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
                iVar7 = std::__cxx11::string::compare((char *)local_2e8);
                bVar13 = iVar7 != 0;
              }
              if (((uVar2 & 5) == 0) && (local_2e8[0] != local_2d8)) {
                operator_delete(local_2e8[0]);
              }
              if (bVar13) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Invalid response",0x10);
                iVar7 = -1;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Response returned with status code ",0x23);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::endl<char,std::char_traits<char>>(poVar8);
                io_service.impl_ = (impl_type *)&header._M_string_length;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&io_service.impl_,"\r\n\r\n","");
                boost::asio::
                read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                          ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                            *)local_6c8,(basic_streambuf<std::allocator<char>_> *)auStack_2c8,
                           (string *)&io_service.impl_);
                if (io_service.impl_ != (impl_type *)&header._M_string_length) {
                  operator_delete(io_service.impl_);
                }
                io_service.impl_ = (impl_type *)&header._M_string_length;
                header._M_dataplus._M_p = (pointer)0x0;
                header._M_string_length._0_1_ = 0;
                while( true ) {
                  cVar6 = std::ios::widen((char)*(undefined8 *)(http_version.field_2._8_8_ + -0x18)
                                          + (char)piVar1);
                  piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (piVar1,(string *)&io_service.impl_,cVar6);
                  if ((((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) ||
                     (iVar7 = std::__cxx11::string::compare((char *)&io_service.impl_), iVar7 == 0))
                  break;
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(char *)io_service.impl_,
                                      (long)header._M_dataplus._M_p);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                if (response._32_8_ != response._8_8_) {
                  std::ostream::operator<<(&std::cout,(streambuf *)auStack_2c8);
                }
                while( true ) {
                  path.field_2._8_8_ = auStack_2c8;
                  sVar11 = boost::asio::
                           read<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_at_least_t>
                                     ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                       *)local_6c8,
                                      (basic_streambuf_ref<std::allocator<char>_> *)
                                      ((long)&path.field_2 + 8),(transfer_at_least_t)0x1,
                                      (error_code *)local_40,(type *)0x0);
                  if (sVar11 == 0) break;
                  std::ostream::operator<<(&std::cout,(streambuf *)auStack_2c8);
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                boost::system::error_code::error_code<boost::asio::error::misc_errors>
                          ((error_code *)((long)&path.field_2 + 8),eof,(type *)0x0);
                if (local_40._0_4_ != path.field_2._8_4_) {
LAB_001235a3:
                  this = (runtime_error *)__cxa_allocate_exception(0x40);
                  std::runtime_error::runtime_error(this,"");
                  *(undefined ***)this = &PTR__system_error_0013c7f0;
                  *(ulong *)(this + 0x10) = CONCAT44(local_40._4_4_,local_40._0_4_);
                  *(undefined8 *)(this + 0x18) = ec._0_8_;
                  *(runtime_error **)(this + 0x20) = this + 0x30;
                  *(undefined8 *)(this + 0x28) = 0;
                  this[0x30] = (runtime_error)0x0;
                  __cxa_throw(this,&boost::system::system_error::typeinfo,
                              boost::system::system_error::~system_error);
                }
                bVar4 = *(long *)(ec._0_8_ + 8) != *(long *)(local_c8 + 8);
                if (*(long *)(local_c8 + 8) == 0) {
                  bVar4 = ec._0_8_ != local_c8;
                }
                if (bVar4) goto LAB_001235a3;
                if (io_service.impl_ != (impl_type *)&header._M_string_length) {
                  operator_delete(io_service.impl_);
                }
                iVar7 = 0;
              }
              if (local_260 != &status_message._M_string_length) {
                operator_delete(local_260);
              }
              if (context.init_.ref_.
                  super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&http_version._M_string_length) {
                operator_delete(context.init_.ref_.
                                super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
              }
              bVar13 = (bool)(bVar13 ^ 1);
              http_version.field_2._8_8_ = _VTT;
              *(undefined8 *)((long)&http_version.field_2 + *(long *)(_VTT + -0x18) + 8) = _typeinfo
              ;
              std::ios_base::~ios_base(local_1f8);
              boost::asio::basic_streambuf<std::allocator<char>_>::~basic_streambuf
                        ((basic_streambuf<std::allocator<char>_> *)auStack_2c8);
              goto LAB_00123011;
            }
            (**(code **)(*(long *)ec._0_8_ + 0x20))
                      ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,local_40._0_4_);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                                (long)_response_stream);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
        }
      }
    }
  }
  if ((ios_base *)http_version.field_2._8_8_ != local_1f8) {
    operator_delete((void *)http_version.field_2._8_8_);
  }
  iVar7 = -1;
  bVar13 = false;
LAB_00123011:
  if (_response_stream != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_response_stream);
  }
  if ((size_type *)query.host_name_.field_2._8_8_ != &query.service_name_._M_string_length) {
    operator_delete((void *)query.host_name_.field_2._8_8_);
  }
  if (query.hints_.ai_next != (addrinfo *)&query.host_name_._M_string_length) {
    operator_delete(query.hints_.ai_next);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)((long)&query.service_name_.field_2 + 8));
  boost::asio::ssl::detail::stream_core::~stream_core
            ((stream_core *)
             &socket.next_layer_.
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_6c8);
  for (plVar12 = *(long **)(server.field_2._8_8_ + 0x38); uVar5 = server.field_2._8_8_,
      plVar12 != (long *)0x0; plVar12 = (long *)plVar12[4]) {
    (**(code **)(*plVar12 + 0x10))(plVar12);
  }
  plVar12 = *(long **)(server.field_2._8_8_ + 0x38);
  while (plVar12 != (long *)0x0) {
    lVar3 = *plVar12;
    plVar12 = (long *)plVar12[4];
    (**(code **)(lVar3 + 8))();
    *(long **)(uVar5 + 0x38) = plVar12;
  }
  if ((void *)server.field_2._8_8_ != (void *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)(server.field_2._8_8_ + 8));
    operator_delete((void *)server.field_2._8_8_);
  }
  boost::asio::ssl::context::~context((context *)((long)&status_message.field_2 + 8));
  std::ios_base::~ios_base((ios_base *)&request_stream);
  local_360 = (undefined1  [8])&PTR__basic_streambuf_0013ce80;
  if (request.max_size_ != 0) {
    operator_delete((void *)request.max_size_);
  }
  local_360 = (undefined1  [8])__assert_fail;
  std::locale::~locale((locale *)&request.field_0x30);
  if (local_c0 != &parameters._M_string_length) {
    operator_delete(local_c0);
  }
  if (local_f0 != &path._M_string_length) {
    operator_delete(local_f0);
  }
  if ((size_type *)parameters.field_2._8_8_ != &server._M_string_length) {
    operator_delete((void *)parameters.field_2._8_8_);
  }
  if (bVar13) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {

  try {

    // Define server and path
    std::string const server = "www.instagram.com";
    std::string const path = "/accounts/login/ajax/";
    std::string const parameters = "username=fewfw&password=fewfw";

    //while (1) {

      // Define request
      boost::asio::streambuf request;
      std::ostream request_stream(&request);
      request_stream << "POST " << path << " HTTP/1.1\r\n";
      request_stream << "Host: " << server << "\r\n";
      // User-Agent is not mandatory
      request_stream << "Accept: */*\r\n";
      // Accept-Language is not mandatory
      // Accept-Encoding is not mandatory
      request_stream << "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n";
      // Content-Type is not mandatory
      // X-Requested-With is not mandatory
      request_stream << "Referer: https://" << server << "/\r\n";
      request_stream << "Content-Length: " << parameters.size() << "\r\n";
      request_stream
        << "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n";
      request_stream << "Connection: close\r\n\r\n";
      request_stream << parameters;

      // Create ssl context
      boost::asio::ssl::context context(boost::asio::ssl::context::sslv23);
      context.set_default_verify_paths();

      // Create io_service
      boost::asio::io_service io_service;

      // Create the boost system error code
      boost::system::error_code ec;

      // Creatre socket
      boost::asio::ssl::stream<boost::asio::ip::tcp::socket> socket(
          io_service,
          context);

      // Get a list of endpoints corresponding to the server name
      boost::asio::ip::tcp::resolver resolver(io_service);
      boost::asio::ip::tcp::resolver::query query(server, "https");
      boost::asio::ip::tcp::resolver::iterator endpoint_iterator = resolver
          .resolve(query, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Resolve OK" << std::endl;

      // Set the peer verification mode
      socket.set_verify_mode(boost::asio::ssl::verify_peer, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Set the callback used to verify peer certificates
      socket.set_verify_callback(boost::bind(verify_certificate, _1, _2), ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Try each endpoint until we successfully establish a connection
      boost::asio::connect(socket.lowest_layer(), endpoint_iterator, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Connect OK" << std::endl;

      // Perform SSL handshaking
      socket.handshake(boost::asio::ssl::stream_base::client, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Handshake OK" << std::endl;

      // Print the request
      std::cout
        << "Print request:"
        << "\n****************************************\n"
        << boost::asio::buffer_cast<const char*>(request.data())
        << "\n****************************************"
        << std::endl;

      // Send the request
      boost::asio::write(socket, request, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Write OK" << std::endl;

      // Read the response status line. The response streambuf will automatically
      // grow to accommodate the entire line. The growth may be limited by passing
      // a maximum size to the streambuf constructor.
      boost::asio::streambuf response;
      boost::asio::read_until(socket, response, "\r\n");

      // Check that response is OK
      std::istream response_stream(&response);
      std::string http_version;
      response_stream >> http_version;
      unsigned int status_code;
      response_stream >> status_code;
      std::string status_message;
      std::getline(response_stream, status_message);
      if (!response_stream || http_version.substr(0, 5) != "HTTP/") {
        std::cout << "Invalid response" << std::endl;
        return -1;
      }

      // Print the response status code
      std::cout
        << "Response returned with status code "
        << status_code
        << std::endl;

      // Read the response headers, which are terminated by a blank line
      boost::asio::read_until(socket, response, "\r\n\r\n");

      // Process the response headers
      std::string header;
      while (std::getline(response_stream, header) && header != "\r") {
        std::cout << header << std::endl;
      }
      std::cout << std::endl;

      // Write whatever content we already have to output
      if (response.size() > 0) {
        std::cout << &response;
      }

      // Read until EOF, writing data to output as we go
      while (boost::asio::read(
          socket,
          response,
          boost::asio::transfer_at_least(1),
          ec)) {
        std::cout << &response;
      }
      std::cout << std::endl;
      if (ec != boost::asio::error::eof) {
        throw boost::system::system_error(ec);
      }

    //}

  } catch (std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}